

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O3

void ourWriteOutJSON(FILE *stream,writeoutvar *mappings,per_transfer *per,CURLcode per_result)

{
  writeoutvar *pwVar1;
  int iVar2;
  char *pcVar3;
  
  fputs("{",(FILE *)stream);
  pcVar3 = mappings->name;
  while (pcVar3 != (char *)0x0) {
    if ((mappings->writefunc !=
         (_func_int_FILE_ptr_writeoutvar_ptr_per_transfer_ptr_CURLcode__Bool *)0x0) &&
       (iVar2 = (*mappings->writefunc)(stream,mappings,per,per_result,true), iVar2 != 0)) {
      fputs(",",(FILE *)stream);
    }
    pwVar1 = mappings + 1;
    mappings = mappings + 1;
    pcVar3 = pwVar1->name;
  }
  curl_mfprintf(stream,"\"curl_version\":\"");
  pcVar3 = (char *)curl_version();
  jsonWriteString(stream,pcVar3);
  curl_mfprintf(stream,"\"}");
  return;
}

Assistant:

void ourWriteOutJSON(FILE *stream, const struct writeoutvar mappings[],
                     struct per_transfer *per, CURLcode per_result)
{
  int i;

  fputs("{", stream);

  for(i = 0; mappings[i].name != NULL; i++) {
    if(mappings[i].writefunc &&
       mappings[i].writefunc(stream, &mappings[i], per, per_result, true))
      fputs(",", stream);
  }

  /* The variables are sorted in alphabetical order but as a special case
     curl_version (which is not actually a --write-out variable) is last. */
  fprintf(stream, "\"curl_version\":\"");
  jsonWriteString(stream, curl_version());
  fprintf(stream, "\"}");
}